

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  string *psVar2;
  uchar value;
  size_t i;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  Message::Message((Message *)&local_60);
  uVar3 = 0;
  do {
    psVar2 = local_58;
    if (str->_M_string_length <= uVar3) {
      StringStreamToString(local_58,local_60._M_head_impl);
      if (local_60._M_head_impl != (stringstream *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
      return psVar2;
    }
    bVar1 = (str->_M_dataplus)._M_p[uVar3];
    switch(bVar1) {
    case 8:
      pcVar4 = "\\b";
      break;
    case 9:
      pcVar4 = "\\t";
      break;
    case 10:
      pcVar4 = "\\n";
      break;
    case 0xb:
switchD_0013b2a2_caseD_b:
      poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
      if ('\x1f' < (char)bVar1) goto LAB_0013b2e2;
      std::operator<<(poVar5,"\\u00");
      String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)bVar1,value);
      std::operator<<((ostream *)(local_60._M_head_impl + 0x10),(string *)&local_50);
      std::__cxx11::string::_M_dispose();
      goto LAB_0013b37e;
    case 0xc:
      pcVar4 = "\\f";
      break;
    case 0xd:
      pcVar4 = "\\r";
      break;
    default:
      if ((0x3a < bVar1 - 0x22) || ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0)
         ) goto switchD_0013b2a2_caseD_b;
      std::operator<<((ostream *)(local_60._M_head_impl + 0x10),'\\');
      poVar5 = (ostream *)(local_60._M_head_impl + 0x10);
LAB_0013b2e2:
      std::operator<<(poVar5,bVar1);
      goto LAB_0013b37e;
    }
    std::operator<<((ostream *)(local_60._M_head_impl + 0x10),pcVar4);
LAB_0013b37e:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}